

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O2

void start_pass_1_quant(j_decompress_ptr cinfo,boolean is_pre_scan)

{
  J_DITHER_MODE JVar1;
  int iVar2;
  JDIMENSION JVar3;
  jpeg_color_quantizer *pjVar4;
  jpeg_error_mgr *pjVar5;
  code *pcVar6;
  _func_void_j_decompress_ptr *p_Var7;
  UINT8 (*paUVar8) [16];
  _func_void_j_decompress_ptr *p_Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  pjVar4 = cinfo->cquantize;
  cinfo->colormap = (JSAMPARRAY)pjVar4[1].start_pass;
  cinfo->actual_number_of_colors = *(int *)&pjVar4[1].color_quantize;
  JVar1 = cinfo->dither_mode;
  if (JVar1 == JDITHER_FS) {
    pjVar4->color_quantize = quantize_fs_dither;
    *(undefined4 *)&pjVar4[4].finish_pass = 0;
    if (pjVar4[3].finish_pass == (_func_void_j_decompress_ptr *)0x0) {
      alloc_fs_workspace(cinfo);
    }
    JVar3 = cinfo->output_width;
    for (lVar12 = 0; lVar12 < cinfo->out_color_components; lVar12 = lVar12 + 1) {
      jzero_far((&pjVar4[3].finish_pass)[lVar12],(ulong)(JVar3 + 2) * 2);
    }
  }
  else if (JVar1 == JDITHER_ORDERED) {
    pcVar6 = quantize_ord_dither;
    if (cinfo->out_color_components == 3) {
      pcVar6 = quantize3_ord_dither;
    }
    pjVar4->color_quantize = pcVar6;
    *(undefined4 *)((long)&pjVar4[2].color_quantize + 4) = 0;
    if (*(int *)&pjVar4[1].new_color_map == 0) {
      create_colorindex(cinfo);
    }
    if (pjVar4[2].finish_pass == (_func_void_j_decompress_ptr *)0x0) {
      pjVar4 = cinfo->cquantize;
      for (lVar12 = 0; lVar12 < cinfo->out_color_components; lVar12 = lVar12 + 1) {
        iVar2 = *(int *)((long)&pjVar4[1].new_color_map + lVar12 * 4 + 4);
        lVar10 = 0;
        do {
          lVar11 = lVar10;
          if (lVar12 == lVar11) goto LAB_00111b90;
          lVar10 = lVar11 + 1;
        } while (iVar2 != *(int *)((long)&pjVar4[1].new_color_map + lVar11 * 4 + 4));
        p_Var7 = (&pjVar4[2].finish_pass)[lVar11];
        if (p_Var7 == (_func_void_j_decompress_ptr *)0x0) {
LAB_00111b90:
          p_Var7 = (_func_void_j_decompress_ptr *)
                   (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x400);
          paUVar8 = base_dither_matrix;
          p_Var9 = p_Var7;
          for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
            for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
              *(int *)(p_Var9 + lVar11 * 4) =
                   (int)((long)((0xff - (ulong)((uint)(*paUVar8)[lVar11] * 2)) * 0xff) /
                        ((long)iVar2 * 0x200 + -0x200));
            }
            p_Var9 = p_Var9 + 0x40;
            paUVar8 = paUVar8 + 1;
          }
        }
        (&pjVar4[2].finish_pass)[lVar12] = p_Var7;
      }
    }
  }
  else {
    if (JVar1 != JDITHER_NONE) {
      pjVar5 = cinfo->err;
      pjVar5->msg_code = 0x30;
      (*pjVar5->error_exit)((j_common_ptr)cinfo);
      return;
    }
    if (cinfo->out_color_components == 3) {
      pcVar6 = color_quantize3;
    }
    else {
      pcVar6 = color_quantize;
    }
    pjVar4->color_quantize = pcVar6;
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_1_quant(j_decompress_ptr cinfo, boolean is_pre_scan)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  size_t arraysize;
  int i;

  /* Install my colormap. */
  cinfo->colormap = cquantize->sv_colormap;
  cinfo->actual_number_of_colors = cquantize->sv_actual;

  /* Initialize for desired dithering mode. */
  switch (cinfo->dither_mode) {
  case JDITHER_NONE:
    if (cinfo->out_color_components == 3)
      cquantize->pub.color_quantize = color_quantize3;
    else
      cquantize->pub.color_quantize = color_quantize;
    break;
  case JDITHER_ORDERED:
    if (cinfo->out_color_components == 3)
      cquantize->pub.color_quantize = quantize3_ord_dither;
    else
      cquantize->pub.color_quantize = quantize_ord_dither;
    cquantize->row_index = 0;   /* initialize state for ordered dither */
    /* If user changed to ordered dither from another mode,
     * we must recreate the color index table with padding.
     * This will cost extra space, but probably isn't very likely.
     */
    if (!cquantize->is_padded)
      create_colorindex(cinfo);
    /* Create ordered-dither tables if we didn't already. */
    if (cquantize->odither[0] == NULL)
      create_odither_tables(cinfo);
    break;
  case JDITHER_FS:
    cquantize->pub.color_quantize = quantize_fs_dither;
    cquantize->on_odd_row = FALSE; /* initialize state for F-S dither */
    /* Allocate Floyd-Steinberg workspace if didn't already. */
    if (cquantize->fserrors[0] == NULL)
      alloc_fs_workspace(cinfo);
    /* Initialize the propagated errors to zero. */
    arraysize = (size_t)((cinfo->output_width + 2) * sizeof(FSERROR));
    for (i = 0; i < cinfo->out_color_components; i++)
      jzero_far((void *)cquantize->fserrors[i], arraysize);
    break;
  default:
    ERREXIT(cinfo, JERR_NOT_COMPILED);
    break;
  }
}